

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# get_perm_c.c
# Opt level: O0

void get_perm_c(int ispec,SuperMatrix *A,int *perm_c)

{
  int *perm;
  int_t *dhead_00;
  int_t *qsize_00;
  int_t *llist_00;
  int_t *marker_00;
  char local_7a8 [8];
  char msg_6 [256];
  char msg_5 [256];
  char msg_4 [256];
  char msg_3 [256];
  char msg_2 [256];
  char msg_1 [256];
  char msg [256];
  double t;
  int_t *marker;
  int_t *llist;
  int_t *qsize;
  int_t *dhead;
  int *invp;
  int_t local_68;
  int_t nofsub;
  int_t maxint;
  int_t delta;
  int_t *b_rowind;
  int_t *b_colptr;
  int_t bnz;
  int_t i;
  int n;
  int m;
  NCformat *Astore;
  int *perm_c_local;
  SuperMatrix *A_local;
  int ispec_local;
  
  _n = (int_t *)A->Store;
  b_colptr._0_4_ = 0;
  i = A->nrow;
  bnz = A->ncol;
  Astore = (NCformat *)perm_c;
  perm_c_local = (int *)A;
  A_local._4_4_ = ispec;
  SuperLU_timer_();
  switch(A_local._4_4_) {
  case 0:
    for (b_colptr._4_4_ = 0; b_colptr._4_4_ < bnz; b_colptr._4_4_ = b_colptr._4_4_ + 1) {
      (&Astore->nnz)[b_colptr._4_4_] = b_colptr._4_4_;
    }
    return;
  case 1:
    getata(i,bnz,*_n,*(int_t **)(_n + 6),*(int_t **)(_n + 4),(int_t *)&b_colptr,&b_rowind,
           (int_t **)&maxint);
    SuperLU_timer_();
    break;
  case 2:
    if (i != bnz) {
      sprintf(msg_1 + 0xf8,"%s at line %d in file %s\n","Matrix is not square",0x1ca,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/get_perm_c.c"
             );
      superlu_abort_and_exit(msg_1 + 0xf8);
    }
    at_plus_a(bnz,*_n,*(int_t **)(_n + 6),*(int_t **)(_n + 4),(int_t *)&b_colptr,&b_rowind,
              (int_t **)&maxint);
    SuperLU_timer_();
    break;
  case 3:
    get_colamd(i,bnz,*_n,*(int_t **)(_n + 6),*(int_t **)(_n + 4),&Astore->nnz);
    return;
  default:
    sprintf(msg_2 + 0xf8,"%s at line %d in file %s\n","Invalid ISPEC",0x1fe,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/get_perm_c.c")
    ;
    superlu_abort_and_exit(msg_2 + 0xf8);
  }
  if ((int)b_colptr == 0) {
    for (b_colptr._4_4_ = 0; b_colptr._4_4_ < bnz; b_colptr._4_4_ = b_colptr._4_4_ + 1) {
      (&Astore->nnz)[b_colptr._4_4_] = b_colptr._4_4_;
    }
  }
  else {
    SuperLU_timer_();
    nofsub = 0;
    local_68 = 0x7fffffff;
    perm = (int *)superlu_malloc((long)bnz << 2);
    if (perm == (int *)0x0) {
      sprintf(msg_3 + 0xf8,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for invp.",0x209,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/get_perm_c.c"
             );
      superlu_abort_and_exit(msg_3 + 0xf8);
    }
    dhead_00 = intMalloc(bnz + nofsub);
    if (dhead_00 == (int_t *)0x0) {
      sprintf(msg_4 + 0xf8,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for dhead.",0x20b,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/get_perm_c.c"
             );
      superlu_abort_and_exit(msg_4 + 0xf8);
    }
    qsize_00 = intMalloc(bnz + nofsub);
    if (qsize_00 == (int_t *)0x0) {
      sprintf(msg_5 + 0xf8,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for qsize.",0x20d,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/get_perm_c.c"
             );
      superlu_abort_and_exit(msg_5 + 0xf8);
    }
    llist_00 = intMalloc(bnz);
    if (llist_00 == (int_t *)0x0) {
      sprintf(msg_6 + 0xf8,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for llist.",0x20f,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/get_perm_c.c"
             );
      superlu_abort_and_exit(msg_6 + 0xf8);
    }
    marker_00 = intMalloc(bnz);
    if (marker_00 == (int_t *)0x0) {
      sprintf(local_7a8,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for marker.",0x211,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/get_perm_c.c"
             );
      superlu_abort_and_exit(local_7a8);
    }
    for (b_colptr._4_4_ = 0; b_colptr._4_4_ <= bnz; b_colptr._4_4_ = b_colptr._4_4_ + 1) {
      b_rowind[b_colptr._4_4_] = b_rowind[b_colptr._4_4_] + 1;
    }
    for (b_colptr._4_4_ = 0; b_colptr._4_4_ < (int)b_colptr; b_colptr._4_4_ = b_colptr._4_4_ + 1) {
      _maxint[b_colptr._4_4_] = _maxint[b_colptr._4_4_] + 1;
    }
    genmmd_(&bnz,b_rowind,_maxint,&Astore->nnz,perm,&nofsub,dhead_00,qsize_00,llist_00,marker_00,
            &local_68,(int_t *)((long)&invp + 4));
    for (b_colptr._4_4_ = 0; b_colptr._4_4_ < bnz; b_colptr._4_4_ = b_colptr._4_4_ + 1) {
      (&Astore->nnz)[b_colptr._4_4_] = (&Astore->nnz)[b_colptr._4_4_] + -1;
    }
    superlu_free(perm);
    superlu_free(dhead_00);
    superlu_free(qsize_00);
    superlu_free(llist_00);
    superlu_free(marker_00);
    superlu_free(_maxint);
    SuperLU_timer_();
  }
  superlu_free(b_rowind);
  return;
}

Assistant:

void
get_perm_c(int ispec, SuperMatrix *A, int *perm_c)
{
    NCformat *Astore = A->Store;
    int m, n;
    int_t i, bnz = 0, *b_colptr, *b_rowind;
    int_t delta, maxint, nofsub;
    int *invp;
    int_t *dhead, *qsize, *llist, *marker;
    double t;
    
    m = A->nrow;
    n = A->ncol;

    t = SuperLU_timer_();
    switch ( ispec ) {
    case (NATURAL): /* Natural ordering */
	for (i = 0; i < n; ++i) perm_c[i] = i;
#if ( PRNTlevel>=1 )
	printf("Use natural column ordering.\n");
#endif
	return;
    case (MMD_ATA): /* Minimum degree ordering on A'*A */
	getata(m, n, Astore->nnz, Astore->colptr, Astore->rowind,
		     &bnz, &b_colptr, &b_rowind);
#if ( PRNTlevel>=1 )
	printf("Use minimum degree ordering on A'*A.\n");
#endif
	t = SuperLU_timer_() - t;
	/*printf("Form A'*A time = %8.3f\n", t);*/
	break;
    case (MMD_AT_PLUS_A): /* Minimum degree ordering on A'+A */
	if ( m != n ) ABORT("Matrix is not square");
	at_plus_a(n, Astore->nnz, Astore->colptr, Astore->rowind,
		  &bnz, &b_colptr, &b_rowind);
#if ( PRNTlevel>=1 )
	printf("Use minimum degree ordering on A'+A.\n");
#endif
	t = SuperLU_timer_() - t;
	/*printf("Form A'+A time = %8.3f\n", t);*/
	break;
    case (COLAMD): /* Approximate minimum degree column ordering. */
	get_colamd(m, n, Astore->nnz, Astore->colptr, Astore->rowind, perm_c);
#if ( PRNTlevel>=1 )
	printf(".. Use approximate minimum degree column ordering.\n");
#endif
	return;
#ifdef HAVE_METIS
    case METIS_ATA: /* METIS ordering on A'*A */
	    getata(m, n, Astore->nnz, Astore->colptr, Astore->rowind,
		     &bnz, &b_colptr, &b_rowind);

	    if ( bnz ) { /* non-empty adjacency structure */
		  get_metis(n, bnz, b_colptr, b_rowind, perm_c);
	    } else { /* e.g., diagonal matrix */
		for (i = 0; i < n; ++i) perm_c[i] = i;
		SUPERLU_FREE(b_colptr);
		/* b_rowind is not allocated in this case */
	    }

#if ( PRNTlevel>=1 )
	    printf(".. Use METIS ordering on A'*A\n");
#endif
	    return;
    case METIS_AT_PLUS_A: /* METIS ordering on A'*A */
	if ( m != n ) ABORT("Matrix is not square");
	at_plus_a(n, Astore->nnz, Astore->colptr, Astore->rowind,
		  &bnz, &b_colptr, &b_rowind);

        if ( bnz ) { /* non-empty adjacency structure */
	    get_metis(n, bnz, b_colptr, b_rowind, perm_c);
        } else { /* e.g., diagonal matrix */
	    for (i = 0; i < n; ++i) perm_c[i] = i;
		SUPERLU_FREE(b_colptr);
	    /* b_rowind is not allocated in this case */
	}

#if ( PRNTlevel>=1 )
	printf(".. Use METIS ordering on A'+A\n");
#endif
	return;
#endif
	
    default:
	ABORT("Invalid ISPEC");
    }

    if ( bnz != 0 ) {
	t = SuperLU_timer_();

	/* Initialize and allocate storage for GENMMD. */
	delta = 0; /* DELTA is a parameter to allow the choice of nodes
		      whose degree <= min-degree + DELTA. */
	maxint = 2147483647; /* 2**31 - 1 */
	invp = (int *) SUPERLU_MALLOC((n+delta)*sizeof(int));
	if ( !invp ) ABORT("SUPERLU_MALLOC fails for invp.");
	dhead = intMalloc(n+delta);
	if ( !dhead ) ABORT("SUPERLU_MALLOC fails for dhead.");
	qsize = intMalloc(n+delta);
	if ( !qsize ) ABORT("SUPERLU_MALLOC fails for qsize.");
	llist = intMalloc(n);
	if ( !llist ) ABORT("SUPERLU_MALLOC fails for llist.");
	marker = intMalloc(n);
	if ( !marker ) ABORT("SUPERLU_MALLOC fails for marker.");

	/* Transform adjacency list into 1-based indexing required by GENMMD.*/
	for (i = 0; i <= n; ++i) ++b_colptr[i];
	for (i = 0; i < bnz; ++i) ++b_rowind[i];
	
	genmmd_(&n, b_colptr, b_rowind, perm_c, invp, &delta, dhead, 
		qsize, llist, marker, &maxint, &nofsub);

	/* Transform perm_c into 0-based indexing. */
	for (i = 0; i < n; ++i) --perm_c[i];

	SUPERLU_FREE(invp);
	SUPERLU_FREE(dhead);
	SUPERLU_FREE(qsize);
	SUPERLU_FREE(llist);
	SUPERLU_FREE(marker);
	SUPERLU_FREE(b_rowind);

	t = SuperLU_timer_() - t;
	/*  printf("call GENMMD time = %8.3f\n", t);*/

    } else { /* Empty adjacency structure */
	for (i = 0; i < n; ++i) perm_c[i] = i;
    }

    SUPERLU_FREE(b_colptr);
}